

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string_view full_name,void *parent,string_view name,
          Message *proto,Symbol symbol)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view v;
  string_view key;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  void *pvVar4;
  LogMessage *this_00;
  size_t sVar5;
  char *__s;
  size_type __n;
  LogSeverity LVar6;
  string_view str;
  string_view str_00;
  string_view element_name;
  string_view name_00;
  size_type dot_pos;
  FileDescriptor *other_file;
  size_t local_a8;
  char *local_a0;
  LogMessage local_98;
  char *local_88;
  undefined1 local_80 [16];
  HiRep local_70;
  code *pcStack_68;
  HiRep local_60;
  code *pcStack_58;
  HiRep local_50;
  code *pcStack_48;
  LogMessage *local_40;
  code *pcStack_38;
  
  local_88 = name._M_str;
  __s = full_name._M_str;
  local_a8 = full_name._M_len;
  if (parent == (void *)0x0) {
    parent = this->file_;
  }
  local_a0 = __s;
  if ((local_a8 == 0) ||
     (pvVar4 = memchr(__s,0,local_a8), (long)pvVar4 - (long)__s == -1 || pvVar4 == (void *)0x0)) {
    bVar3 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol);
    if (bVar3) {
      name_00._M_str = local_88;
      name_00._M_len = name._M_len;
      bVar3 = FileDescriptorTables::AddAliasUnderParent(this->file_tables_,parent,name_00,symbol);
      if (bVar3) {
        return true;
      }
      if (this->had_errors_ == false) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x161a);
        str._M_str = "\"";
        str._M_len = 1;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_98,str);
        v._M_str = local_a0;
        v._M_len = local_a8;
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_98,v);
        str_00._M_str =
             "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
        ;
        str_00._M_len = 0x70;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_00);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_98);
      }
    }
    else {
      key._M_str = local_a0;
      key._M_len = local_a8;
      local_98._0_8_ = DescriptorPool::Tables::FindSymbol(this->tables_,key);
      local_80._8_8_ = Symbol::GetFile((Symbol *)&local_98);
      if ((FileDescriptor *)local_80._8_8_ == this->file_) {
        sVar5 = local_a8;
        if (local_a8 == 0) {
LAB_001c7192:
          local_80._0_8_ = 0xffffffffffffffff;
        }
        else {
          do {
            local_80._0_8_ = sVar5 - 1;
            if (sVar5 == 0) goto LAB_001c7192;
            lVar1 = sVar5 - 1;
            sVar5 = local_80._0_8_;
          } while (local_a0[lVar1] != '.');
        }
        if (local_80._0_8_ == 0xffffffffffffffff) {
          pcStack_48 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__1,std::__cxx11::string>
          ;
          LVar6 = 0x1ddc19;
          local_50 = (HiRep)&local_98;
        }
        else {
          local_98.data_._M_t.
          super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          ._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                )local_80;
          pcStack_58 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__2,std::__cxx11::string>
          ;
          pcVar2 = pcStack_58;
          pcStack_58._0_4_ = 0x1ddc72;
          LVar6 = (LogSeverity)pcStack_58;
          local_60 = (HiRep)&local_98;
          pcStack_58 = pcVar2;
        }
      }
      else {
        local_98.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(local_80 + 8);
        pcStack_68 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__3,std::__cxx11::string>
        ;
        pcVar2 = pcStack_68;
        pcStack_68._0_4_ = 0x1ddd17;
        LVar6 = (LogSeverity)pcStack_68;
        local_70 = (HiRep)&local_98;
        pcStack_68 = pcVar2;
      }
      local_98._0_8_ = &local_a8;
      make_error_00.invoker_._0_4_ = LVar6;
      make_error_00.ptr_.obj = &local_98;
      make_error_00.invoker_._4_4_ = 0;
      element_name._M_str = local_a0;
      element_name._M_len = local_a8;
      AddError(this,element_name,proto,NAME,make_error_00);
    }
  }
  else {
    local_98._0_8_ = &local_a8;
    local_40 = &local_98;
    pcStack_38 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__0,std::__cxx11::string>
    ;
    make_error.invoker_._0_4_ = 0x1ddbc0;
    make_error.ptr_.obj = local_40;
    make_error.invoker_._4_4_ = 0;
    AddError(this,full_name,proto,NAME,make_error);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(const absl::string_view full_name,
                                  const void* parent,
                                  const absl::string_view name,
                                  const Message& proto, Symbol symbol) {
  // If the caller passed nullptr for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == nullptr) parent = file_;

  if (absl::StrContains(full_name, '\0')) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", full_name, "\" contains null character.");
    });
    return false;
  }
  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        ABSL_DLOG(FATAL) << "\"" << full_name
                         << "\" not previously defined in "
                            "symbols_by_name_, but was defined in "
                            "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      std::string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == std::string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name, "\" is already defined.");
        });
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name.substr(dot_pos + 1),
                              "\" is already defined in \"",
                              full_name.substr(0, dot_pos), "\".");
        });
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::StrCat(
            "\"", full_name, "\" is already defined in file \"",
            (other_file == nullptr ? "null" : other_file->name()), "\".");
      });
    }
    return false;
  }
}